

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O1

int ncnn::convolution1d(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                       int stride_w,int dilation_w,int activation_type,Mat *activation_params,
                       Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  float *pfVar11;
  int iVar12;
  long lVar13;
  float *pfVar14;
  void *pvVar15;
  float *pfVar16;
  ulong uVar17;
  float *pfVar18;
  ulong uVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  ulong local_c8;
  
  uVar2 = top_blob->h;
  pvVar6 = bias_data->data;
  if (pvVar6 == (void *)0x0) {
    bVar20 = true;
    lVar13 = 0;
  }
  else {
    lVar13 = (long)bias_data->c * bias_data->cstep;
    bVar20 = lVar13 == 0;
  }
  iVar12 = (int)lVar13;
  if (0 < (int)uVar2) {
    uVar3 = bottom_blob->h;
    iVar4 = top_blob->w;
    pvVar7 = top_blob->data;
    sVar8 = top_blob->elemsize;
    pvVar9 = weight_data->data;
    iVar12 = 0;
    local_c8 = 0;
    do {
      if (0 < iVar4) {
        pfVar16 = (float *)bottom_blob->data;
        iVar5 = bottom_blob->w;
        sVar10 = bottom_blob->elemsize;
        pfVar11 = (float *)activation_params->data;
        lVar13 = 0;
        do {
          fVar23 = 0.0;
          if (!bVar20) {
            fVar23 = *(float *)((long)pvVar6 + local_c8 * 4);
          }
          if (0 < (int)uVar3) {
            uVar17 = 0;
            pfVar14 = pfVar16;
            pvVar15 = (void *)((long)pvVar9 + (long)iVar12 * 4);
            do {
              if (0 < kernel_w) {
                uVar19 = 0;
                pfVar18 = pfVar14;
                do {
                  fVar23 = fVar23 + *(float *)((long)pvVar15 + uVar19 * 4) * *pfVar18;
                  uVar19 = uVar19 + 1;
                  pfVar18 = pfVar18 + dilation_w;
                } while ((uint)kernel_w != uVar19);
              }
              uVar17 = uVar17 + 1;
              pvVar15 = (void *)((long)pvVar15 + (long)kernel_w * 4);
              pfVar14 = (float *)((long)pfVar14 + (long)iVar5 * sVar10);
            } while (uVar17 != uVar3);
          }
          fVar21 = fVar23;
          switch(activation_type) {
          case 1:
            if (fVar23 <= 0.0) {
              fVar21 = 0.0;
            }
            break;
          case 2:
            fVar21 = (float)(~-(uint)(0.0 < fVar23) & (uint)*pfVar11 |
                            -(uint)(0.0 < fVar23) & 0x3f800000) * fVar23;
            break;
          case 3:
            if (fVar23 <= *pfVar11) {
              fVar23 = *pfVar11;
            }
            fVar21 = pfVar11[1];
            if (fVar23 <= pfVar11[1]) {
              fVar21 = fVar23;
            }
            break;
          case 4:
            if (88.37626 <= fVar23) {
              fVar23 = 88.37626;
            }
            fVar23 = expf((float)(-(uint)(fVar23 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar23 < -88.37626) & (uint)-fVar23));
            fVar21 = 1.0 / (fVar23 + 1.0);
            break;
          case 5:
            fVar21 = expf(fVar23);
            fVar21 = logf(fVar21 + 1.0);
            fVar21 = tanhf(fVar21);
            fVar21 = fVar21 * fVar23;
            break;
          case 6:
            fVar1 = *pfVar11;
            fVar22 = -pfVar11[1] / fVar1;
            fVar21 = 0.0;
            if ((fVar22 <= fVar23) && (fVar21 = fVar23, fVar23 <= fVar22 + 1.0 / fVar1)) {
              fVar21 = (fVar1 * fVar23 + pfVar11[1]) * fVar23;
            }
          }
          *(float *)((long)pvVar7 + lVar13 * 4 + sVar8 * (long)iVar4 * local_c8) = fVar21;
          lVar13 = lVar13 + 1;
          pfVar16 = pfVar16 + stride_w;
        } while (lVar13 != iVar4);
      }
      local_c8 = local_c8 + 1;
      iVar12 = iVar12 + uVar3 * kernel_w;
    } while (local_c8 != uVar2);
  }
  return iVar12;
}

Assistant:

static int convolution1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outh; p++)
    {
        float* outptr = top_blob.row(p);

        for (int j = 0; j < outw; j++)
        {
            float sum = 0.f;

            if (bias_term)
                sum = bias_data[p];

            const float* kptr = (const float*)weight_data + kernel_w * h * p;

            for (int q = 0; q < h; q++)
            {
                const float* sptr = bottom_blob.row(q) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float wt = kptr[k];
                    sum += val * wt;

                    sptr += dilation_w;
                }

                kptr += kernel_w;
            }

            sum = activation_ss(sum, activation_type, activation_params);

            outptr[j] = sum;
        }
    }

    return 0;
}